

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O2

void Qentem::Test::TestMathUTag1(QTest *test)

{
  Value<char16_t> *pVVar1;
  StringStream<char16_t> *pSVar2;
  StringStream<char16_t> ss;
  Value<char16_t> value;
  
  ss.storage_ = (char16_t *)0x0;
  ss.length_ = 0;
  ss.capacity_ = 0;
  value.field_0.array_.storage_ = (Value<char16_t> *)0x0;
  value.field_0._8_8_ = 0;
  value.type_ = Undefined;
  pVVar1 = Value<char16_t>::operator[](&value,L"a1");
  Value<char16_t>::operator=(pVVar1,5);
  pVVar1 = Value<char16_t>::operator[](&value,L"a2");
  Value<char16_t>::reset(pVVar1);
  pVVar1->type_ = True;
  pVVar1 = Value<char16_t>::operator[](&value,L"a3");
  Value<char16_t>::reset(pVVar1);
  pVVar1->type_ = Null;
  pVVar1 = Value<char16_t>::operator[](&value,L"a4");
  Value<char16_t>::reset(pVVar1);
  pVVar1->type_ = False;
  pVVar1 = Value<char16_t>::operator[](&value,L"a5");
  Value<char16_t>::operator=(pVVar1,L"10");
  pVVar1 = Value<char16_t>::operator[](&value,L"a6");
  Value<char16_t>::operator=(pVVar1,L"20");
  pVVar1 = Value<char16_t>::operator[](&value,L"a7");
  Value<char16_t>::operator=(pVVar1,6);
  pVVar1 = Value<char16_t>::operator[](&value,L"a8");
  Value<char16_t>::operator=(pVVar1,1);
  pVVar1 = Value<char16_t>::operator[](&value,L"a9");
  Value<char16_t>::operator=(pVVar1,L"1");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1+1}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x129110,0x6f9);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+8}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"13",0x6fc);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a7}+8}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"14",0x6ff);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a7}+{var:a1}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x11f6e6,0x702);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a5}+{var:a1}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x705);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a5}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x708);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}+{var:a5}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x124910,0x70b);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*{var:a2}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x11f2ec,0x70e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*{var:a4}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121a8e,0x711);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*{var:a7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"120",0x714);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a7}+{var:a6}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"26",0x717);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a2}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x11f326,0x71a);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a8}=={var:a2}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x71d);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a2}=={var:a8}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x720);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a5}!={var:a1}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x723);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a2}!={var:a4}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x726);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a2}==true}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x729);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a9}=={var:a8}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x72c);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a8}=={var:a9}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x72f);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1=={var:a8}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x732);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:6-5==({var:a9})}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x735);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:6-5==({var:a8})}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x738);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:null!={var:a3}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121a8e,0x73b);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:({var:a3})==(0)}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x73e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x11f6e6,0x741);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}{math:{var:a1}+{var:a7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"1111",0x745);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}*{math:{var:a1}+{var:a7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"11*11",0x749);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}##{math:{var:a1}+{var:a7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"11##11",0x74d);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}&&&%%^^&&*{math:{var:a1}+{var:a7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[15]>
            (test,pSVar2,(char16_t (*) [15])L"11&&&%%^^&&*11",0x751);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: {var:a1}+8}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"13",0x756);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  {var:a7}+8}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"14",0x759);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:     {var:a7}+{var:a1}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x11f6e6,0x75c);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a5} +{var:a1}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x75f);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}  +{var:a5}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x762);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}    +{var:a5}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x124910,0x765);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}* {var:a2}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x11f2ec,0x768);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*  {var:a4}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121a8e,0x76b);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*      {var:a7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"120",0x76e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a7}+{var:a6} }",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"26",0x771);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a2}  }",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x11f326,0x774);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a8}=={var:a2}      }",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x777);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a2}=={var:a8}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x77a);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: {var:a5}!={var:a1} }",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x77d);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  {var:a2}!={var:a4}  }",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x780);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:    1=={var:a9}     }",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x783);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a9} == {var:a8}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x786);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a8}  ==  {var:a9}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x789);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1==          {var:a8}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x78c);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:6-5         ==1}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x78f);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1          ==            {var:a8}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x792);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:     0     !=    ({var:a3})        }",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121a8e,0x795);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a3}       ==       null     }",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x798);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:((8+1+{var:a8}))}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x1209e0,0x79b);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:10==(8+1+{var:a8})}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x79e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:((8+1+{var:a8}))==9+1}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x7a1);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:(5*2)==((8+1+{var:a8}))}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x7a4);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char16_t>::Reset(&value);
  Value<char16_t>::operator+=(&value,5);
  Value<char16_t>::operator+=(&value,true);
  Value<char16_t>::operator+=(&value,(NullType)0x0);
  Value<char16_t>::operator+=(&value,false);
  Value<char16_t>::operator+=(&value,L"10");
  Value<char16_t>::operator+=(&value,L"20");
  Value<char16_t>::operator+=(&value,6);
  Value<char16_t>::operator+=(&value,1);
  Value<char16_t>::operator+=(&value,L"1");
  Value<char16_t>::operator+=(&value,L"Qentem");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:0}+8}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"13",0x7b5);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:6}+8}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"14",0x7b8);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:6}+{var:0}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x11f6e6,0x7bb);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:4}+{var:0}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x7be);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:0}+{var:4}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x7c1);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:5}+{var:4}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x124910,0x7c4);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:5}*{var:1}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x11f2ec,0x7c7);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:5}*{var:3}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121a8e,0x7ca);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:5}*{var:6}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"120",0x7cd);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:6}+{var:5}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"26",2000);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:0}+{var:1}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x11f326,0x7d3);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:7}=={var:1}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x7d6);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:1}=={var:7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x7d9);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:4}!={var:0}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x7dc);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:1}!={var:3}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x7df);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:({var:1})==({var:8})}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x7e2);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"-{math:{var:8}=={var:7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x1200cc,0x7e5);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"--{math:{var:7}=={var:8}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])0x1200ca,0x7e8);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"---{math:1=={var:7}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"---1",0x7eb);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1==({var:8})}-",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"1-",0x7ee);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:6-5==({var:7})}--",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"1--",0x7f1);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:0==({var:2})}---",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])0x12021e,0x7f4);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"-{math:{var:2}!=null}-",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"-0-",0x7f7);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"--{math:Qente=={var:9}}--",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"--0--",0x7fa);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"---{math:Qente !={var:9}}---",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"---1---",0x7fd);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  Qentem   =={var:9}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x800);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  Qentem!={var:9}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121a8e,0x803);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:9}   ==    Qente}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121a8e,0x806);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:9} !=    Qente    }",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x809);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  {var:9}   ==Qentem}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x80c);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: {var:9} !=Qentem}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121a8e,0x80f);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: true == {var:1}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x814);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: {var:1} == true}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x121b28,0x817);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: 8 /2}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x11f182,0x81a);
  Value<char16_t>::~Value(&value);
  Memory::Deallocate(ss.storage_);
  return;
}

Assistant:

static void TestMathUTag1(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;

    value[uR"(a1)"] = 5;
    value[uR"(a2)"] = true;
    value[uR"(a3)"] = nullptr;
    value[uR"(a4)"] = false;
    value[uR"(a5)"] = uR"(10)";
    value[uR"(a6)"] = uR"(20)";
    value[uR"(a7)"] = 6;
    value[uR"(a8)"] = 1;
    value[uR"(a9)"] = uR"(1)";

    test.IsEqual(Template::Render(uR"({math:1+1})", value, ss), uR"(2)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+8})", value, ss), uR"(13)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+8})", value, ss), uR"(14)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+{var:a1}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a5}+{var:a1}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a5}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}+{var:a5}})", value, ss), uR"(30)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*{var:a2}})", value, ss), uR"(20)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*{var:a4}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*{var:a7}})", value, ss), uR"(120)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+{var:a6}})", value, ss), uR"(26)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a2}})", value, ss), uR"(6)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}=={var:a2}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a5}!={var:a1}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}!={var:a4}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}==true})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a9}=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}=={var:a9}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5==({var:a9})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5==({var:a8})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:null!={var:a3}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:({var:a3})==(0)})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}{math:{var:a1}+{var:a7}})", value, ss), uR"(1111)",
                 __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}*{math:{var:a1}+{var:a7}})", value, ss), uR"(11*11)",
                 __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}##{math:{var:a1}+{var:a7}})", value, ss), uR"(11##11)",
                 __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}&&&%%^^&&*{math:{var:a1}+{var:a7}})", value, ss),
                 uR"(11&&&%%^^&&*11)", __LINE__);
    ss.Clear();

    ///////////////////

    test.IsEqual(Template::Render(uR"({math: {var:a1}+8})", value, ss), uR"(13)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  {var:a7}+8})", value, ss), uR"(14)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:     {var:a7}+{var:a1}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a5} +{var:a1}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}  +{var:a5}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}    +{var:a5}})", value, ss), uR"(30)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}* {var:a2}})", value, ss), uR"(20)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*  {var:a4}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*      {var:a7}})", value, ss), uR"(120)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+{var:a6} })", value, ss), uR"(26)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a2}  })", value, ss), uR"(6)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}=={var:a2}      })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: {var:a5}!={var:a1} })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  {var:a2}!={var:a4}  })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:    1=={var:a9}     })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a9} == {var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}  ==  {var:a9}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1==          {var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5         ==1})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1          ==            {var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:     0     !=    ({var:a3})        })", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a3}       ==       null     })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:((8+1+{var:a8}))})", value, ss), uR"(10)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:10==(8+1+{var:a8})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:((8+1+{var:a8}))==9+1})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:(5*2)==((8+1+{var:a8}))})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    //////////////
    value.Reset();

    value += 5;
    value += true;
    value += nullptr;
    value += false;
    value += uR"(10)";
    value += uR"(20)";
    value += 6;
    value += 1;
    value += uR"(1)";
    value += uR"(Qentem)";

    test.IsEqual(Template::Render(uR"({math:{var:0}+8})", value, ss), uR"(13)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:6}+8})", value, ss), uR"(14)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:6}+{var:0}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:4}+{var:0}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:0}+{var:4}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}+{var:4}})", value, ss), uR"(30)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}*{var:1}})", value, ss), uR"(20)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}*{var:3}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}*{var:6}})", value, ss), uR"(120)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:6}+{var:5}})", value, ss), uR"(26)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:0}+{var:1}})", value, ss), uR"(6)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:7}=={var:1}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:1}=={var:7}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:4}!={var:0}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:1}!={var:3}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:({var:1})==({var:8})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(-{math:{var:8}=={var:7}})", value, ss), uR"(-1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(--{math:{var:7}=={var:8}})", value, ss), uR"(--1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(---{math:1=={var:7}})", value, ss), uR"(---1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1==({var:8})}-)", value, ss), uR"(1-)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5==({var:7})}--)", value, ss), uR"(1--)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:0==({var:2})}---)", value, ss), uR"(1---)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(-{math:{var:2}!=null}-)", value, ss), uR"(-0-)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(--{math:Qente=={var:9}}--)", value, ss), uR"(--0--)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(---{math:Qente !={var:9}}---)", value, ss), uR"(---1---)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  Qentem   =={var:9}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  Qentem!={var:9}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:9}   ==    Qente})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:9} !=    Qente    })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  {var:9}   ==Qentem})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: {var:9} !=Qentem})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    /////////

    test.IsEqual(Template::Render(uR"({math: true == {var:1}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: {var:1} == true})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: 8 /2})", value, ss), uR"(4)", __LINE__);
}